

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

Int __thiscall ipx::LpSolver::Solve(LpSolver *this)

{
  bool bVar1;
  ipxint iVar2;
  pointer pBVar3;
  Control *in_RDI;
  double dVar4;
  Basis *this_00;
  Basis *this_01;
  bad_alloc *anon_var_0;
  stringstream h_logging_stream;
  LpSolver *in_stack_00000250;
  exception *e;
  Int method_status;
  bool run_crossover;
  bool run_crossover_not_off;
  bool run_crossover_choose;
  bool run_crossover_on;
  Info *in_stack_000004b8;
  ostream *in_stack_000004c0;
  int local_334;
  Control *in_stack_fffffffffffffcd0;
  LpSolver *in_stack_fffffffffffffce0;
  Basis *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffd48;
  string *str;
  Control *in_stack_fffffffffffffd50;
  Control *this_02;
  byte local_29b;
  byte local_29a;
  byte local_299;
  LpSolver *in_stack_fffffffffffffd90;
  LpSolver *in_stack_fffffffffffffea0;
  LpSolver *in_stack_fffffffffffffeb0;
  undefined1 local_91 [40];
  allocator local_69;
  string local_68 [32];
  byte local_48;
  byte local_47;
  undefined1 local_46;
  byte local_45;
  allocator local_31;
  string local_30 [44];
  Int local_4;
  
  bVar1 = Model::empty((Model *)0x8366db);
  if (bVar1) {
    in_RDI[1].parameters_.super_ipx_parameters.display = 0x3ee;
    local_4 = 0x3ee;
  }
  else {
    ClearSolution(in_stack_fffffffffffffea0);
    Control::ResetTimer((Control *)0x83671d);
    Control::OpenLogfile(&in_stack_fffffffffffffce0->control_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"IPX version 1.0\n",&local_31);
    Control::hLog(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    InteriorPointSolve(in_stack_fffffffffffffd90);
    iVar2 = Control::run_crossover(in_RDI);
    local_45 = iVar2 == 1;
    iVar2 = Control::run_crossover(in_RDI);
    local_46 = iVar2 == -1;
    local_299 = 1;
    if (!(bool)local_46) {
      local_299 = local_45;
    }
    local_47 = local_299 & 1;
    if ((*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 != 1) ||
       (local_29a = 1, (local_45 & 1) == 0)) {
      local_29b = 0;
      if (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 2) {
        local_29b = local_47;
      }
      local_29a = local_29b;
    }
    local_48 = local_29a;
    if (local_29a != 0) {
      if ((local_45 & 1) == 0) {
        if ((bool)local_46) {
          str = (string *)local_91;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_91 + 1),"Running crossover since IPX is imprecise\n",
                     (allocator *)str);
          Control::hLog(in_stack_fffffffffffffd50,str);
          std::__cxx11::string::~string((string *)(local_91 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_91);
        }
      }
      else {
        this_02 = in_RDI;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"Running crossover as requested\n",&local_69);
        Control::hLog(this_02,in_stack_fffffffffffffd48);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
      BuildCrossoverStartingPoint(in_stack_fffffffffffffce0);
      RunCrossover(in_stack_fffffffffffffeb0);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836d04);
    if (bVar1) {
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836d21);
      dVar4 = Basis::frac_ftran_sparse(pBVar3);
      *(double *)&in_RDI[1].field_0x158 = dVar4;
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836d53);
      dVar4 = Basis::frac_btran_sparse(pBVar3);
      *(double *)&in_RDI[1].field_0x160 = dVar4;
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836d85);
      this_00 = (Basis *)Basis::time_factorize(pBVar3);
      *(Basis **)&in_RDI[1].field_0x178 = this_00;
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836db7);
      in_stack_fffffffffffffcf0 = (Basis *)Basis::time_update(pBVar3);
      *(Basis **)&in_RDI[1].field_0x180 = in_stack_fffffffffffffcf0;
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836de9);
      this_01 = (Basis *)Basis::time_ftran(pBVar3);
      *(Basis **)&in_RDI[1].field_0x168 = this_01;
      pBVar3 = std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                         ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836e1b);
      dVar4 = Basis::time_btran(pBVar3);
      *(double *)&in_RDI[1].field_0x170 = dVar4;
      std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836e4d);
      dVar4 = Basis::mean_fill(this_00);
      *(double *)&in_RDI[1].field_0x188 = dVar4;
      std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836e7f);
      in_stack_fffffffffffffcd0 = (Control *)Basis::max_fill(this_01);
      *(Control **)&in_RDI[1].field_0x190 = in_stack_fffffffffffffcd0;
    }
    if ((((*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 3) ||
         (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 4)) ||
        (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile == 3)) ||
       (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile == 4)) {
      in_RDI[1].parameters_.super_ipx_parameters.display = 1000;
    }
    else {
      if ((local_48 & 1) == 0) {
        local_334 = *(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4;
      }
      else {
        local_334 = *(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile;
      }
      if ((local_334 == 1) || (local_334 == 2)) {
        in_RDI[1].parameters_.super_ipx_parameters.display = 1000;
      }
      else {
        in_RDI[1].parameters_.super_ipx_parameters.display = 0x3ed;
      }
    }
    PrintSummary(in_stack_00000250);
    dVar4 = Control::Elapsed((Control *)0x836b5e);
    *(double *)&in_RDI[1].parameters_.super_ipx_parameters.bad_products_tolerance = dVar4;
    Control::Debug(in_RDI,2);
    operator<<(in_stack_000004c0,in_stack_000004b8);
    Control::CloseLogfile(in_stack_fffffffffffffcd0);
    bVar1 = Control::reportBasisData(in_RDI);
    if (bVar1) {
      std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x836bc6);
      Basis::reportBasisData(in_stack_fffffffffffffcf0);
    }
    local_4 = in_RDI[1].parameters_.super_ipx_parameters.display;
  }
  return local_4;
}

Assistant:

Int LpSolver::Solve() {
    if (model_.empty())
        return info_.status = IPX_STATUS_no_model;
    ClearSolution();
    control_.ResetTimer();
    control_.OpenLogfile();
    control_.hLog("IPX version 1.0\n");
    try {
        InteriorPointSolve();
	const bool run_crossover_on = control_.run_crossover() == 1;
	const bool run_crossover_choose = control_.run_crossover() == -1;
	const bool run_crossover_not_off = run_crossover_choose || run_crossover_on;
	const bool run_crossover =
	  (info_.status_ipm == IPX_STATUS_optimal && run_crossover_on) ||
	  (info_.status_ipm == IPX_STATUS_imprecise && run_crossover_not_off);
	//        if ((info_.status_ipm == IPX_STATUS_optimal ||
	//             info_.status_ipm == IPX_STATUS_imprecise) && run_crossover_on) {
	if (run_crossover) {
	    if (run_crossover_on) {
	      control_.hLog("Running crossover as requested\n");
	    } else if (run_crossover_choose) {
	      assert(info_.status_ipm == IPX_STATUS_imprecise);
	      control_.hLog("Running crossover since IPX is imprecise\n");
	    } else {
	      assert(run_crossover_on || run_crossover_choose);
	    }
	    BuildCrossoverStartingPoint();
            RunCrossover();
        }
        if (basis_) {
            info_.ftran_sparse = basis_->frac_ftran_sparse();
            info_.btran_sparse = basis_->frac_btran_sparse();
            info_.time_lu_invert = basis_->time_factorize();
            info_.time_lu_update = basis_->time_update();
            info_.time_ftran = basis_->time_ftran();
            info_.time_btran = basis_->time_btran();
            info_.mean_fill = basis_->mean_fill();
            info_.max_fill = basis_->max_fill();
        }
        if (info_.status_ipm == IPX_STATUS_primal_infeas ||
            info_.status_ipm == IPX_STATUS_dual_infeas ||
            info_.status_crossover == IPX_STATUS_primal_infeas ||
            info_.status_crossover == IPX_STATUS_dual_infeas) {
            // When IPM or crossover detect the model to be infeasible
            // (currently only the former is implemented), then the problem is
            // solved.
            info_.status = IPX_STATUS_solved;
        } else {
            Int method_status = run_crossover ?
                info_.status_crossover : info_.status_ipm;
            if (method_status == IPX_STATUS_optimal ||
                method_status == IPX_STATUS_imprecise)
                info_.status = IPX_STATUS_solved;
            else
                info_.status = IPX_STATUS_stopped;
        }
        PrintSummary();
    }
    catch (const std::bad_alloc&) {
      control_.hLog(" out of memory\n");
        info_.status = IPX_STATUS_out_of_memory;
    }
    catch (const std::exception& e) {
      std::stringstream h_logging_stream;
      h_logging_stream.str(std::string());
      h_logging_stream << " internal error: " << e.what() << '\n';
      control_.hLog(h_logging_stream);
      info_.status = IPX_STATUS_internal_error;
    }
    info_.time_total = control_.Elapsed();
    control_.Debug(2) << info_;
    control_.CloseLogfile();
    if (control_.reportBasisData())
      basis_->reportBasisData();
    return info_.status;
}